

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborValue::QCborValue(QCborValue *this,QByteArray *ba)

{
  QCborContainerPrivate *this_00;
  char *pcVar1;
  qsizetype len;
  QByteArray *in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffac;
  Type type;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  QCborContainerPrivate::QCborContainerPrivate(this_00);
  in_RDI->usedData = (size_type)this_00;
  *(undefined4 *)&(in_RDI->data).d.d = 0x40;
  pcVar1 = QByteArray::constData((QByteArray *)0x46ed50);
  type = (Type)((ulong)pcVar1 >> 0x20);
  len = QByteArray::size(in_RSI);
  uVar2 = *(undefined4 *)&(in_RDI->data).d.d;
  QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x46ed85);
  QCborContainerPrivate::appendByteData
            (in_RDI,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),len,type,
             (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)SUB84((ulong)lVar3 >> 0x20,0));
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)this_00,in_stack_ffffffffffffffac);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue::QCborValue(const QByteArray &ba)
    : n(0), container(new QCborContainerPrivate), t(ByteArray)
{
    container->appendByteData(ba.constData(), ba.size(), t);
    container->ref.storeRelaxed(1);
}